

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O0

void uo_tcp_conn_before_recv(uo_cb *cb)

{
  int rfd;
  void *pvVar1;
  ptrdiff_t pVar2;
  uchar *buf;
  size_t len;
  uo_buf local_20;
  uo_buf rbuf;
  uo_tcp_conn *tcp_conn;
  uo_cb *cb_local;
  
  pvVar1 = uo_cb_stack_index(cb,0);
  local_20 = *(uo_buf *)((long)pvVar1 + 0x40);
  pVar2 = uo_buf_get_len_after_ptr(local_20);
  if (pVar2 == 0) {
    local_20 = uo_buf_realloc_2x(local_20);
    *(uo_buf *)((long)pvVar1 + 0x40) = local_20;
  }
  uo_cb_prepend_func(cb,uo_tcp_conn_recv);
  rfd = *(int *)((long)pvVar1 + 0x60);
  buf = uo_buf_get_ptr(local_20);
  len = uo_buf_get_len_after_ptr(local_20);
  uo_io_read_async(rfd,buf,len,cb);
  return;
}

Assistant:

static void uo_tcp_conn_before_recv(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    uo_buf rbuf = tcp_conn->rbuf;

    if (!uo_buf_get_len_after_ptr(rbuf))
        rbuf = tcp_conn->rbuf = uo_buf_realloc_2x(rbuf);

    uo_cb_prepend(cb, uo_tcp_conn_recv);

    uo_io_read_async(
        tcp_conn->sockfd,
        uo_buf_get_ptr(rbuf),
        uo_buf_get_len_after_ptr(rbuf),
        cb);
}